

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::Inserter::insertOne
          (Inserter *this,qsizetype pos,OrderedScreen *t)

{
  qsizetype in_RSI;
  OrderedScreen *in_RDI;
  qsizetype i;
  OrderedScreen *in_stack_ffffffffffffffe0;
  OrderedScreen *this_00;
  
  setup((Inserter *)in_RDI,in_RSI,1);
  if ((in_RDI->vinfo).output.name.d.d == (Data *)0x0) {
    OrderedScreen::OrderedScreen(in_stack_ffffffffffffffe0,in_RDI);
    *(long *)&(in_RDI->vinfo).virtualPos.yp = *(long *)&(in_RDI->vinfo).virtualPos.yp + 1;
    for (this_00 = (OrderedScreen *)0x0;
        this_00 != (OrderedScreen *)(in_RDI->vinfo).output.name.d.size;
        this_00 = (OrderedScreen *)((long)&this_00[-1].vinfo.output.mode_blob_id + 3)) {
      OrderedScreen::operator=(this_00,in_RDI);
    }
    OrderedScreen::operator=(this_00,in_RDI);
  }
  else {
    OrderedScreen::OrderedScreen(in_stack_ffffffffffffffe0,in_RDI);
    *(long *)&(in_RDI->vinfo).virtualPos.yp = *(long *)&(in_RDI->vinfo).virtualPos.yp + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }